

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_handle.cpp
# Opt level: O2

void __thiscall
libtorrent::torrent_handle::
async_call<void(libtorrent::aux::torrent::*)(std::__cxx11::string_const&,libtorrent::move_flags_t),std::__cxx11::string_const&,libtorrent::move_flags_t&>
          (torrent_handle *this,offset_in_torrent_to_subr f,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *a,move_flags_t *a_1)

{
  io_context *ctx;
  undefined1 *in_R8;
  shared_ptr<libtorrent::aux::torrent> t;
  __shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> local_90;
  undefined1 local_80 [40];
  string local_58 [40];
  
  ::std::__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_90,this);
  if (local_90._M_ptr != (element_type *)0x0) {
    local_80._0_8_ = ((local_90._M_ptr)->super_torrent_hot_members).m_ses;
    ctx = ((session_impl *)local_80._0_8_)->m_io_context;
    ::std::__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)(local_80 + 8),
               &local_90);
    local_80._24_8_ = f;
    local_80._32_8_ = a;
    ::std::__cxx11::string::string(local_58,(string *)a_1);
    local_58[0x20] = (string)*in_R8;
    boost::asio::
    dispatch<boost::asio::io_context,libtorrent::torrent_handle::async_call<void(libtorrent::aux::torrent::*)(std::__cxx11::string_const&,libtorrent::move_flags_t),std::__cxx11::string_const&,libtorrent::move_flags_t&>(void(libtorrent::aux::torrent::*)(std::__cxx11::string_const&,libtorrent::move_flags_t),std::__cxx11::string_const&,libtorrent::move_flags_t&)const::_lambda()_1_>
              (ctx,(type_conflict *)local_80,(type *)0x0);
    const::{lambda()#1}::~async_call((_lambda___1_ *)local_80);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90._M_refcount);
    return;
  }
  local_80._0_4_ = 0x14;
  aux::throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>
            ((error_code_enum *)local_80);
}

Assistant:

void torrent_handle::async_call(Fun f, Args&&... a) const
	{
		auto t = m_torrent.lock();
		if (!t) aux::throw_ex<system_error>(errors::invalid_torrent_handle);
		auto& ses = static_cast<session_impl&>(t->session());
		dispatch(ses.get_context(), [=,&ses] ()
		{
#ifndef BOOST_NO_EXCEPTIONS
			try {
#endif
				(t.get()->*f)(std::move(a)...);
#ifndef BOOST_NO_EXCEPTIONS
			} catch (system_error const& e) {
				ses.alerts().emplace_alert<torrent_error_alert>(torrent_handle(t)
					, e.code(), e.what());
			} catch (std::exception const& e) {
				ses.alerts().emplace_alert<torrent_error_alert>(torrent_handle(t)
					, error_code(), e.what());
			} catch (...) {
				ses.alerts().emplace_alert<torrent_error_alert>(torrent_handle(t)
					, error_code(), "unknown error");
			}
#endif
		} );
	}